

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O0

void __thiscall Fir1::Fir1(Fir1 *this,double *_coefficients,uint number_of_taps)

{
  ulong uVar1;
  void *pvVar2;
  uint in_EDX;
  long in_RSI;
  long *in_RDI;
  uint i;
  uint local_18;
  
  uVar1 = SUB168(ZEXT416(in_EDX) * ZEXT816(8),0);
  if (SUB168(ZEXT416(in_EDX) * ZEXT816(8),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar1);
  *in_RDI = (long)pvVar2;
  uVar1 = SUB168(ZEXT416(in_EDX) * ZEXT816(8),0);
  if (SUB168(ZEXT416(in_EDX) * ZEXT816(8),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar1);
  memset(pvVar2,0,uVar1);
  in_RDI[1] = (long)pvVar2;
  *(uint *)(in_RDI + 2) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  in_RDI[3] = 0;
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    *(undefined8 *)(*in_RDI + (ulong)local_18 * 8) = *(undefined8 *)(in_RSI + (ulong)local_18 * 8);
    *(undefined8 *)(in_RDI[1] + (ulong)local_18 * 8) = 0;
  }
  return;
}

Assistant:

Fir1::Fir1(const double *_coefficients,const unsigned number_of_taps) :
	coefficients(new double[number_of_taps]),
	buffer(new double[number_of_taps]()),
	taps(number_of_taps) {
	for(unsigned int i=0;i<number_of_taps;i++) {
		coefficients[i] = _coefficients[i];
		buffer[i] = 0;
	}
}